

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::MutablePatternModifier::processQuantity
          (MutablePatternModifier *this,DecimalQuantity *fq,MicroProps *micros,UErrorCode *status)

{
  undefined8 uVar1;
  bool bVar2;
  int8_t iVar3;
  Form plural;
  undefined1 local_80 [8];
  DecimalQuantity copy;
  MutablePatternModifier *nonConstThis;
  UErrorCode *status_local;
  MicroProps *micros_local;
  DecimalQuantity *fq_local;
  MutablePatternModifier *this_local;
  
  (*this->fParent->_vptr_MicroPropsGenerator[2])(this->fParent,fq,micros,status);
  copy._72_8_ = this;
  bVar2 = needsPlurals(this);
  uVar1 = copy._72_8_;
  if (bVar2) {
    DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_80,fq);
    RoundingImpl::apply(&micros->rounder,(DecimalQuantity *)local_80,status);
    uVar1 = copy._72_8_;
    iVar3 = DecimalQuantity::signum(fq);
    plural = utils::getStandardPlural(this->fRules,(IFixedDecimal *)local_80);
    setNumberProperties((MutablePatternModifier *)uVar1,iVar3,plural);
    DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_80);
  }
  else {
    iVar3 = DecimalQuantity::signum(fq);
    setNumberProperties((MutablePatternModifier *)uVar1,iVar3,COUNT);
  }
  micros->modMiddle = &this->super_Modifier;
  return;
}

Assistant:

void MutablePatternModifier::processQuantity(DecimalQuantity& fq, MicroProps& micros,
                                             UErrorCode& status) const {
    fParent->processQuantity(fq, micros, status);
    // The unsafe code path performs self-mutation, so we need a const_cast.
    // This method needs to be const because it overrides a const method in the parent class.
    auto nonConstThis = const_cast<MutablePatternModifier*>(this);
    if (needsPlurals()) {
        // TODO: Fix this. Avoid the copy.
        DecimalQuantity copy(fq);
        micros.rounder.apply(copy, status);
        nonConstThis->setNumberProperties(fq.signum(), utils::getStandardPlural(fRules, copy));
    } else {
        nonConstThis->setNumberProperties(fq.signum(), StandardPlural::Form::COUNT);
    }
    micros.modMiddle = this;
}